

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int parse_7zip_uint64(archive_read *a,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  pbVar2 = header_bytes(a,1);
  iVar3 = -1;
  if (pbVar2 != (byte *)0x0) {
    bVar1 = *pbVar2;
    *val = 0;
    uVar4 = 0x80;
    lVar5 = 0;
    do {
      if ((uVar4 & bVar1) == 0) {
        *val = *val + ((ulong)(uVar4 - 1 & (uint)bVar1) << ((byte)lVar5 & 0x3f));
        break;
      }
      pbVar2 = header_bytes(a,1);
      if (pbVar2 == (byte *)0x0) {
        return -1;
      }
      *val = *val | (ulong)*pbVar2 << ((byte)lVar5 & 0x3f);
      uVar4 = uVar4 >> 1;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x40);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
parse_7zip_uint64(struct archive_read *a, uint64_t *val)
{
	const unsigned char *p;
	unsigned char avail, mask;
	int i;

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	avail = *p;
	mask = 0x80;
	*val = 0;
	for (i = 0; i < 8; i++) {
		if (avail & mask) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			*val |= ((uint64_t)*p) << (8 * i);
			mask >>= 1;
			continue;
		}
		*val += ((uint64_t)(avail & (mask -1))) << (8 * i);
		break;
	}
	return (0);
}